

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

bool __thiscall raptor::Server::Start(Server *this)

{
  bool bVar1;
  Status *pSVar2;
  undefined8 uVar3;
  undefined8 in_R9;
  Status local_50;
  undefined1 local_20 [8];
  raptor_error e;
  Server *this_local;
  
  e._value = (Status *)this;
  TcpServer::Start((TcpServer *)local_20);
  bVar1 = RefCountedPtr<raptor::Status>::operator!=
                    ((RefCountedPtr<raptor::Status> *)local_20,(nullptr_t)0x0);
  if (bVar1) {
    pSVar2 = RefCountedPtr<raptor::Status>::operator->((RefCountedPtr<raptor::Status> *)local_20);
    Status::ToString_abi_cxx11_(&local_50);
    uVar3 = std::__cxx11::string::c_str();
    LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/server.cc"
                   ,0x47,kLogLevelError,"server: start (%s)",uVar3,in_R9,pSVar2);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this_local._7_1_ = !bVar1;
  RefCountedPtr<raptor::Status>::~RefCountedPtr((RefCountedPtr<raptor::Status> *)local_20);
  return this_local._7_1_;
}

Assistant:

bool Server::Start() {
    raptor_error e = _impl->Start();
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server: start (%s)", e->ToString().c_str());
        return false;
    }

    return true;
}